

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

idx_t __thiscall duckdb::FSSTCompressionState::Finalize(FSSTCompressionState *this)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  CompressionInfo *this_01;
  uint32_t *puVar1;
  data_ptr_t __s;
  uint *src;
  uint uVar2;
  pointer pCVar3;
  BufferManager *pBVar4;
  idx_t iVar5;
  data_ptr_t pdVar6;
  type segment;
  InternalException *this_02;
  ulong __n;
  idx_t iVar7;
  allocator local_69;
  BufferHandle handle;
  string local_50;
  
  this_00 = &this->current_segment;
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  pBVar4 = BufferManager::GetBufferManager(pCVar3->db);
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  (*pBVar4->_vptr_BufferManager[7])(&handle,pBVar4,&pCVar3->block);
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  iVar5 = BitpackingPrimitives::GetRequiredSize
                    ((pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
                     super___atomic_base<unsigned_long>._M_i,this->current_width);
  iVar7 = (this->current_dictionary).size + iVar5 + 0x10 + this->fsst_serialized_symbol_table_size;
  if (iVar7 == this->last_fitting_size) {
    pdVar6 = BufferHandle::Ptr(&handle);
    src = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    BitpackingPrimitives::PackBuffer<unsigned_int,false>
              (pdVar6 + 0x10,src,
               (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
               super___atomic_base<unsigned_long>._M_i,this->current_width);
    __s = pdVar6 + iVar5 + 0x10;
    if (this->fsst_encoder == (duckdb_fsst_encoder_t *)0x0) {
      switchD_0049f7f1::default(__s,0,this->fsst_serialized_symbol_table_size);
    }
    else {
      switchD_00916250::default
                (__s,this->fsst_serialized_symbol_table,this->fsst_serialized_symbol_table_size);
    }
    uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(iVar5 + 0x10);
    *(uint *)(pdVar6 + 0xc) = uVar2;
    *(uint *)(pdVar6 + 8) = (uint)this->current_width;
    this_01 = &(this->super_CompressionState).info;
    iVar5 = CompressionInfo::GetCompactionFlushLimit(this_01);
    if (iVar7 < iVar5) {
      iVar5 = CompressionInfo::GetBlockSize(this_01);
      __n = (ulong)(this->current_dictionary).size;
      memmove(__s + this->fsst_serialized_symbol_table_size,
              pdVar6 + ((this->current_dictionary).end - __n),__n);
      puVar1 = &(this->current_dictionary).end;
      *puVar1 = *puVar1 + ((int)iVar7 - (int)iVar5);
      segment = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                ::operator*(this_00);
      FSSTStorage::SetDictionary(segment,&handle,this->current_dictionary);
    }
    else {
      iVar7 = CompressionInfo::GetBlockSize(this_01);
    }
    BufferHandle::~BufferHandle(&handle);
    return iVar7;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"FSST string compression failed due to incorrect size calculation",
             &local_69);
  InternalException::InternalException(this_02,&local_50);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Finalize() {
		auto &buffer_manager = BufferManager::GetBufferManager(current_segment->db);
		auto handle = buffer_manager.Pin(current_segment->block);
		D_ASSERT(current_dictionary.end == info.GetBlockSize());

		// calculate sizes
		auto compressed_index_buffer_size =
		    BitpackingPrimitives::GetRequiredSize(current_segment->count, current_width);
		auto total_size = sizeof(fsst_compression_header_t) + compressed_index_buffer_size + current_dictionary.size +
		                  fsst_serialized_symbol_table_size;

		if (total_size != last_fitting_size) {
			throw InternalException("FSST string compression failed due to incorrect size calculation");
		}

		// calculate ptr and offsets
		auto base_ptr = handle.Ptr();
		auto header_ptr = reinterpret_cast<fsst_compression_header_t *>(base_ptr);
		auto compressed_index_buffer_offset = sizeof(fsst_compression_header_t);
		auto symbol_table_offset = compressed_index_buffer_offset + compressed_index_buffer_size;

		D_ASSERT(current_segment->count == index_buffer.size());
		BitpackingPrimitives::PackBuffer<sel_t, false>(base_ptr + compressed_index_buffer_offset,
		                                               reinterpret_cast<uint32_t *>(index_buffer.data()),
		                                               current_segment->count, current_width);

		// Write the fsst symbol table or nothing
		if (fsst_encoder != nullptr) {
			memcpy(base_ptr + symbol_table_offset, &fsst_serialized_symbol_table[0], fsst_serialized_symbol_table_size);
		} else {
			memset(base_ptr + symbol_table_offset, 0, fsst_serialized_symbol_table_size);
		}

		Store<uint32_t>(NumericCast<uint32_t>(symbol_table_offset),
		                data_ptr_cast(&header_ptr->fsst_symbol_table_offset));
		Store<uint32_t>((uint32_t)current_width, data_ptr_cast(&header_ptr->bitpacking_width));

		if (total_size >= info.GetCompactionFlushLimit()) {
			// the block is full enough, don't bother moving around the dictionary
			return info.GetBlockSize();
		}

		// the block has space left: figure out how much space we can save
		auto move_amount = info.GetBlockSize() - total_size;
		// move the dictionary so it lines up exactly with the offsets
		auto new_dictionary_offset = symbol_table_offset + fsst_serialized_symbol_table_size;
		memmove(base_ptr + new_dictionary_offset, base_ptr + current_dictionary.end - current_dictionary.size,
		        current_dictionary.size);
		current_dictionary.end -= move_amount;
		D_ASSERT(current_dictionary.end == total_size);
		// write the new dictionary (with the updated "end")
		FSSTStorage::SetDictionary(*current_segment, handle, current_dictionary);

		return total_size;
	}